

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_sbar.cpp
# Opt level: O2

DHUDMessage * __thiscall DBaseStatusBar::DetachMessage(DBaseStatusBar *this,DHUDMessage *msg)

{
  anon_union_8_2_947301c2_for_TObjPtr<DHUDMessage>_1 *paVar1;
  anon_union_8_2_947301c2_for_TObjPtr<DHUDMessage>_1 *obj;
  DHUDMessage *pDVar2;
  TObjPtr<DHUDMessage> TVar3;
  size_t i;
  long lVar4;
  
  lVar4 = 0;
  do {
    if (lVar4 == 3) {
      return (DHUDMessage *)0x0;
    }
    paVar1 = &this->Messages[lVar4].field_0;
    do {
      obj = paVar1;
      pDVar2 = GC::ReadBarrier<DHUDMessage>((DHUDMessage **)obj);
      if (pDVar2 == (DHUDMessage *)0x0) break;
      paVar1 = &(pDVar2->Next).field_0;
    } while (pDVar2 != msg);
    lVar4 = lVar4 + 1;
    if (pDVar2 != (DHUDMessage *)0x0) {
      TVar3.field_0 =
           (anon_union_8_2_947301c2_for_TObjPtr<DHUDMessage>_1)
           GC::ReadBarrier<DHUDMessage>((DHUDMessage **)&pDVar2->Next);
      *obj = TVar3.field_0;
      (pDVar2->Next).field_0.p = (DHUDMessage *)0x0;
      if (screen != (DFrameBuffer *)0x0) {
        ST_SetNeedRefresh();
      }
      return pDVar2;
    }
  } while( true );
}

Assistant:

DHUDMessage *DBaseStatusBar::DetachMessage (DHUDMessage *msg)
{
	for (size_t i = 0; i < countof(Messages); ++i)
	{
		DHUDMessage *probe = Messages[i];
		DHUDMessage **prev = &Messages[i];

		while (probe && probe != msg)
		{
			prev = &probe->Next;
			probe = probe->Next;
		}
		if (probe != NULL)
		{
			*prev = probe->Next;
			probe->Next = NULL;
			// Redraw the status bar in case it was covered
			if (screen != NULL)
			{
				ST_SetNeedRefresh();
			}
			return probe;
		}
	}
	return NULL;
}